

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper1.cpp
# Opt level: O0

void master_table_create_dictionary
               (planck_unit_test_t *tc,MasterTable *master_table,Dictionary<int,_int> *dictionary,
               ion_dictionary_id_t id,ion_key_type_t key_type,ion_key_size_t key_size,
               ion_value_size_t value_size,ion_dictionary_size_t dictionary_size,
               ion_dictionary_type_t dictionary_type)

{
  planck_unit_result_t pVar1;
  undefined1 local_4c [8];
  ion_dictionary_config_info_t config;
  ion_key_size_t key_size_local;
  ion_key_type_t key_type_local;
  ion_dictionary_id_t id_local;
  Dictionary<int,_int> *dictionary_local;
  MasterTable *master_table_local;
  planck_unit_test_t *tc_local;
  
  config.dictionary_type = key_size;
  config._28_4_ = key_type;
  pVar1 = planck_unit_assert_int_are_equal
                    (tc,0,(int)(dictionary->dict).status,0xaf,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                    );
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar1 = planck_unit_assert_int_are_equal
                    (tc,id,((dictionary->dict).instance)->id,0xb0,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                    );
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar1 = planck_unit_assert_int_are_equal
                    (tc,config._28_4_,((dictionary->dict).instance)->key_type,0xb1,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                    );
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar1 = planck_unit_assert_int_are_equal
                    (tc,config.dictionary_type,(((dictionary->dict).instance)->record).key_size,0xb2
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                    );
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar1 = planck_unit_assert_int_are_equal
                    (tc,value_size,(((dictionary->dict).instance)->record).value_size,0xb3,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                    );
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar1 = planck_unit_assert_int_are_equal
                    (tc,dictionary_size,dictionary->dict_size,0xb4,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                    );
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar1 = planck_unit_assert_int_are_equal
                    (tc,dictionary_type,((dictionary->dict).instance)->type,0xb5,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                    );
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  master_table_lookup_dictionary
            (tc,master_table,id,config._28_4_,config.dictionary_type,value_size,dictionary_size,
             dictionary_type,(ion_dictionary_config_info_t *)local_4c,'\x01');
  return;
}

Assistant:

void
master_table_create_dictionary(
	planck_unit_test_t *tc,
	MasterTable *master_table,
	Dictionary<int, int>	*dictionary,
	ion_dictionary_id_t id,
	ion_key_type_t key_type,
	ion_key_size_t key_size,
	ion_value_size_t value_size,
	ion_dictionary_size_t dictionary_size,
	ion_dictionary_type_t dictionary_type
) {
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, ion_dictionary_status_ok, dictionary->dict.status);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, id, dictionary->dict.instance->id);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, key_type, dictionary->dict.instance->key_type);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, key_size, dictionary->dict.instance->record.key_size);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, value_size, dictionary->dict.instance->record.value_size);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, dictionary_size, dictionary->dict_size);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, dictionary_type, dictionary->dict.instance->type);

	ion_dictionary_config_info_t config;

	master_table_lookup_dictionary(tc, master_table, id, key_type, key_size, value_size, dictionary_size, dictionary_type, &config, boolean_true);
}